

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O0

bool __thiscall
ResourceManager::GetEncapsulatedFileEntry
          (ResourceManager *this,FileId FileIndex,ResRefT *ResRef,ResType *Type)

{
  IResourceAccessor<NWN::ResRef32> *pIVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  IResourceAccessor<NWN::ResRef32> *Accessor;
  bool local_1;
  
  sVar3 = std::
          vector<ResourceManager::ResourceEntry,_std::allocator<ResourceManager::ResourceEntry>_>::
          size((vector<ResourceManager::ResourceEntry,_std::allocator<ResourceManager::ResourceEntry>_>
                *)(in_RDI + 0x1d0));
  if (in_RSI < sVar3) {
    pvVar4 = std::
             vector<ResourceManager::ResourceEntry,_std::allocator<ResourceManager::ResourceEntry>_>
             ::operator[]((vector<ResourceManager::ResourceEntry,_std::allocator<ResourceManager::ResourceEntry>_>
                           *)(in_RDI + 0x1d0),in_RSI);
    pIVar1 = pvVar4->Accessor;
    pvVar4 = std::
             vector<ResourceManager::ResourceEntry,_std::allocator<ResourceManager::ResourceEntry>_>
             ::operator[]((vector<ResourceManager::ResourceEntry,_std::allocator<ResourceManager::ResourceEntry>_>
                           *)(in_RDI + 0x1d0),in_RSI);
    iVar2 = (*pIVar1->_vptr_IResourceAccessor[6])(pIVar1,pvVar4->FileIndex,in_RDX,in_RCX);
    local_1 = (bool)((byte)iVar2 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
ResourceManager::GetEncapsulatedFileEntry(
	 FileId FileIndex,
	 ResRefT & ResRef,
	 ResType & Type
	)
/*++

Routine Description:

	This routine reads an encapsulated file directory entry, returning the name
	and type of a particular resource.  The enumeration is stable across calls.

Arguments:

	FileIndex - Supplies the index into the logical directory entry to reutrn.

	ResRef - Receives the resource name.

	Type - Receives the resource type.

Return Value:

	The routine returns a Boolean value indicating success or failure.  The
	routine always succeeds as long as the caller provides a legal file index.

Environment:

	User mode.

--*/
{
	IResourceAccessor * Accessor;

	if ((size_t) FileIndex >= m_ResourceEntries.size( ))
		return false;

	Accessor = m_ResourceEntries[ (size_t) FileIndex ].Accessor;

	return Accessor->GetEncapsulatedFileEntry(
		m_ResourceEntries[ (size_t) FileIndex ].FileIndex,
		ResRef,
		Type);
}